

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O0

Matrix<double,_1,__1,_1,_1,__1> __thiscall
lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs
          (FeHierarchicQuad<double> *this,Matrix<double,_1,__1,_1,_1,__1> *nodevals)

{
  value_type_conflict3 vVar1;
  value_type_conflict3 vVar2;
  value_type_conflict3 vVar3;
  uint uVar4;
  int iVar5;
  const_reference pvVar6;
  const_reference ppQVar7;
  CoeffReturnType pdVar8;
  Scalar *pSVar9;
  DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pDVar10;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pDVar11;
  reference peVar12;
  DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *other;
  Scalar *dataPtr;
  uint uVar13;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *in_RDX;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar14;
  array<unsigned_int,_4UL> *paVar15;
  double dVar16;
  double dVar17;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1572:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  CVar18;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1588:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  CVar19;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1605:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  CVar20;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1623:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  CVar21;
  Matrix<double,_1,__1,_1,_1,__1> MVar22;
  size_type local_7b8;
  size_type local_7b4;
  size_type local_7b0;
  size_type local_7ac;
  Type local_790;
  Stride<0,_0> local_752;
  Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> local_750;
  Type local_730;
  RowXpr local_6f8;
  ColXpr local_6c0;
  Matrix<double,_1,__1,_1,_1,__1> local_688;
  undefined1 local_678 [16];
  Type local_668;
  uint local_62c;
  uint local_628;
  uint i_2;
  undefined1 local_620 [8];
  Matrix<double,__1,__1,_0,__1,__1> dof_temp2;
  Type local_5d0;
  Matrix<double,_1,__1,_1,_1,__1> local_598;
  undefined1 local_588 [16];
  Type local_578;
  uint local_540;
  uint local_53c;
  uint i_1;
  Matrix<double,__1,__1,_0,__1,__1> dof_temp;
  undefined1 local_518 [4];
  size_type Nq;
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>
  local_4e0;
  NestedExpressionType local_4a8;
  non_const_type local_4a0;
  NestedExpressionType local_498;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_490;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
  local_478;
  Scalar local_418;
  double integ4;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1623:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_408;
  undefined1 local_3f8 [8];
  Matrix<double,_1,__1,_1,_1,__1> psidd_3;
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>
  local_3b0;
  NestedExpressionType local_378;
  non_const_type local_370;
  NestedExpressionType local_368;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_360;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
  local_348;
  Scalar local_2e8;
  double integ3;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1605:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_2d8;
  undefined1 local_2c8 [8];
  Matrix<double,_1,__1,_1,_1,__1> psidd_2;
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>
  local_280;
  NestedExpressionType local_248;
  non_const_type local_240;
  NestedExpressionType local_238;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_230;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
  local_218;
  Scalar local_1b8;
  double integ2;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1588:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_1a8;
  undefined1 local_198 [8];
  Matrix<double,_1,__1,_1,_1,__1> psidd_1;
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>
  local_150;
  NestedExpressionType local_118;
  non_const_type local_110;
  NestedExpressionType local_108;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_100;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
  local_e8;
  Scalar local_88;
  double integ1;
  CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1572:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_78;
  undefined1 local_68 [8];
  Matrix<double,_1,__1,_1,_1,__1> psidd;
  double P1;
  double P0;
  size_type i;
  size_type local_38;
  size_type local_34;
  size_type Ne3;
  size_type Ne2;
  size_type Ne1;
  size_type Ne0;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *local_20;
  Matrix<double,_1,__1,_1,_1,__1> *nodevals_local;
  FeHierarchicQuad<double> *this_local;
  Matrix<double,_1,__1,_1,_1,__1> *dofs;
  
  Ne0._3_1_ = 0;
  local_20 = in_RDX;
  nodevals_local = nodevals;
  this_local = this;
  Ne1 = NumRefShapeFunctions((FeHierarchicQuad<double> *)nodevals);
  Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::Matrix<unsigned_int>
            ((Matrix<double,_1,__1,_1,_1,__1> *)this,&Ne1);
  pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                     ((array<unsigned_int,_4UL> *)
                      ((long)&(nodevals->
                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                              m_storage.m_cols + 4),0);
  if (*pvVar6 < 2) {
    local_7ac = 0;
  }
  else {
    ppQVar7 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_4UL> *)(nodevals + 2),0);
    local_7ac = quad::QuadRule::NumPoints(*ppQVar7);
  }
  Ne2 = local_7ac;
  pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                     ((array<unsigned_int,_4UL> *)
                      ((long)&(nodevals->
                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                              m_storage.m_cols + 4),1);
  if (*pvVar6 < 2) {
    local_7b0 = 0;
  }
  else {
    ppQVar7 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_4UL> *)(nodevals + 2),1);
    local_7b0 = quad::QuadRule::NumPoints(*ppQVar7);
  }
  Ne3 = local_7b0;
  pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                     ((array<unsigned_int,_4UL> *)
                      ((long)&(nodevals->
                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                              m_storage.m_cols + 4),2);
  if (*pvVar6 < 2) {
    local_7b4 = 0;
  }
  else {
    ppQVar7 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_4UL> *)(nodevals + 2),2);
    local_7b4 = quad::QuadRule::NumPoints(*ppQVar7);
  }
  local_34 = local_7b4;
  pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                     ((array<unsigned_int,_4UL> *)
                      ((long)&(nodevals->
                              super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                              m_storage.m_cols + 4),3);
  if (*pvVar6 < 2) {
    local_7b8 = 0;
  }
  else {
    ppQVar7 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[]
                        ((array<const_lf::quad::QuadRule_*,_4UL> *)(nodevals + 2),3);
    local_7b8 = quad::QuadRule::NumPoints(*ppQVar7);
  }
  local_38 = local_7b8;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](local_20,0)
  ;
  dVar16 = *pdVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,0);
  *pSVar9 = dVar16;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](local_20,1)
  ;
  dVar16 = *pdVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,1);
  *pSVar9 = dVar16;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](local_20,2)
  ;
  dVar16 = *pdVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,2);
  *pSVar9 = dVar16;
  pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](local_20,3)
  ;
  dVar16 = *pdVar8;
  pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,3);
  *pSVar9 = dVar16;
  P0._0_4_ = 2;
  while( true ) {
    uVar13 = P0._0_4_;
    uVar4 = Degree((FeHierarchicQuad<double> *)nodevals);
    if (uVar4 + 1 <= uVar13) break;
    dVar16 = ILegendreDx(P0._0_4_,0.0,1.0);
    psidd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols =
         (Index)ILegendreDx(P0._0_4_,1.0,1.0);
    uVar13 = P0._0_4_;
    pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                       ((array<unsigned_int,_4UL> *)
                        ((long)&(nodevals->
                                super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                m_storage.m_cols + 4),0);
    if (uVar13 <= *pvVar6) {
      ppQVar7 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[]
                          ((array<const_lf::quad::QuadRule_*,_4UL> *)(nodevals + 2),0);
      pDVar10 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)quad::QuadRule::Points(*ppQVar7);
      integ1 = (double)&P0;
      CVar18 = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
               unaryExpr<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_>
                         (pDVar10,(anon_class_8_1_54a39809_for_op *)&integ1);
      local_78 = CVar18;
      Eigen::Matrix<double,1,-1,1,1,-1>::
      Matrix<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                ((Matrix<double,1,_1,1,1,_1> *)local_68,
                 (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1572:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_78);
      ppQVar7 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[]
                          ((array<const_lf::quad::QuadRule_*,_4UL> *)(nodevals + 2),0);
      pDVar11 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                quad::QuadRule::Weights(*ppQVar7);
      local_110 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(pDVar11);
      local_108.m_matrix =
           (non_const_type)
           Eigen::MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::
           array((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                 &local_110);
      local_118 = (NestedExpressionType)
                  Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                            ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_68);
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
      ::operator*(&local_100,
                  (ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                   *)&local_108,
                  (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)
                  &local_118);
      Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
                ((Type *)&psidd_1.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                          m_storage.m_cols,
                 (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_20,4,Ne2);
      Eigen::MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>::
      array(&local_150,
            (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_> *
            )&psidd_1.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols);
      Eigen::
      ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>>
      ::operator*(&local_e8,
                  (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>>
                   *)&local_100,
                  (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                   *)&local_150);
      local_88 = Eigen::
                 DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>_>
                 ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>_>
                        *)&local_e8);
      peVar12 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                          ((span<const_lf::mesh::Orientation,_18446744073709551615UL> *)
                           &nodevals[5].
                            super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                            .m_cols,0);
      IVar14 = psidd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols
      ;
      if (*peVar12 == positive) {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,1);
        dVar17 = *pdVar8;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,0);
        dVar17 = ((double)IVar14 * dVar17 - dVar16 * *pdVar8) - local_88;
        iVar5 = P0._0_4_ * 2;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                            (ulong)(P0._0_4_ + 2));
        *pSVar9 = dVar17 * (double)(iVar5 - 1);
      }
      else {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,0);
        dVar17 = *pdVar8;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,1);
        uVar13 = P0._0_4_;
        dVar17 = ((double)IVar14 * dVar17 - dVar16 * *pdVar8) - local_88;
        iVar5 = P0._0_4_ * 2;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            ((long)&(nodevals->
                                    super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                    m_storage.m_cols + 4),0);
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                            (ulong)(~uVar13 + 5 + *pvVar6));
        *pSVar9 = dVar17 * (double)(iVar5 - 1);
      }
      Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_68);
    }
    uVar13 = P0._0_4_;
    pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                       ((array<unsigned_int,_4UL> *)
                        ((long)&(nodevals->
                                super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                m_storage.m_cols + 4),1);
    if (uVar13 <= *pvVar6) {
      ppQVar7 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[]
                          ((array<const_lf::quad::QuadRule_*,_4UL> *)(nodevals + 2),1);
      pDVar10 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)quad::QuadRule::Points(*ppQVar7);
      integ2 = (double)&P0;
      CVar19 = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
               unaryExpr<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_2_>
                         (pDVar10,(anon_class_8_1_54a39809_for_op *)&integ2);
      local_1a8 = CVar19;
      Eigen::Matrix<double,1,-1,1,1,-1>::
      Matrix<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_2_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                ((Matrix<double,1,_1,1,1,_1> *)local_198,
                 (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1588:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_1a8);
      ppQVar7 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[]
                          ((array<const_lf::quad::QuadRule_*,_4UL> *)(nodevals + 2),1);
      pDVar11 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                quad::QuadRule::Weights(*ppQVar7);
      local_240 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(pDVar11);
      local_238.m_matrix =
           (non_const_type)
           Eigen::MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::
           array((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                 &local_240);
      local_248 = (NestedExpressionType)
                  Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                            ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_198);
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
      ::operator*(&local_230,
                  (ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                   *)&local_238,
                  (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)
                  &local_248);
      Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
                ((Type *)&psidd_2.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                          m_storage.m_cols,
                 (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_20,(ulong)(Ne2 + 4),Ne3
                );
      Eigen::MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>::
      array(&local_280,
            (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_> *
            )&psidd_2.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols);
      Eigen::
      ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>>
      ::operator*(&local_218,
                  (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>>
                   *)&local_230,
                  (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                   *)&local_280);
      local_1b8 = Eigen::
                  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>_>
                  ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>_>
                         *)&local_218);
      peVar12 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                          ((span<const_lf::mesh::Orientation,_18446744073709551615UL> *)
                           &nodevals[5].
                            super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                            .m_cols,1);
      IVar14 = psidd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols
      ;
      if (*peVar12 == positive) {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,2);
        dVar17 = *pdVar8;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,1);
        uVar13 = P0._0_4_;
        dVar17 = ((double)IVar14 * dVar17 - dVar16 * *pdVar8) - local_1b8;
        iVar5 = P0._0_4_ * 2;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                           ((array<unsigned_int,_4UL> *)
                            ((long)&(nodevals->
                                    super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                    m_storage.m_cols + 4),0);
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                            (ulong)(*pvVar6 + 1 + uVar13));
        *pSVar9 = dVar17 * (double)(iVar5 - 1);
      }
      else {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,1);
        dVar17 = *pdVar8;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,2);
        uVar13 = P0._0_4_;
        dVar17 = ((double)IVar14 * dVar17 - dVar16 * *pdVar8) - local_1b8;
        iVar5 = P0._0_4_ * 2;
        paVar15 = (array<unsigned_int,_4UL> *)
                  ((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>)
                          .m_storage.m_cols + 4);
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,0);
        vVar1 = *pvVar6;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,1);
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                            (ulong)(((vVar1 + *pvVar6) - uVar13) + 3));
        *pSVar9 = dVar17 * (double)(iVar5 - 1);
      }
      Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_198);
    }
    uVar13 = P0._0_4_;
    pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                       ((array<unsigned_int,_4UL> *)
                        ((long)&(nodevals->
                                super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                m_storage.m_cols + 4),2);
    if (uVar13 <= *pvVar6) {
      ppQVar7 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[]
                          ((array<const_lf::quad::QuadRule_*,_4UL> *)(nodevals + 2),2);
      pDVar10 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)quad::QuadRule::Points(*ppQVar7);
      integ3 = (double)&P0;
      CVar20 = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
               unaryExpr<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_3_>
                         (pDVar10,(anon_class_8_1_54a39809_for_op *)&integ3);
      local_2d8 = CVar20;
      Eigen::Matrix<double,1,-1,1,1,-1>::
      Matrix<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_3_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                ((Matrix<double,1,_1,1,1,_1> *)local_2c8,
                 (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1605:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_2d8);
      ppQVar7 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[]
                          ((array<const_lf::quad::QuadRule_*,_4UL> *)(nodevals + 2),2);
      pDVar11 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                quad::QuadRule::Weights(*ppQVar7);
      local_370 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(pDVar11);
      local_368.m_matrix =
           (non_const_type)
           Eigen::MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::
           array((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                 &local_370);
      local_378 = (NestedExpressionType)
                  Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                            ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_2c8);
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
      ::operator*(&local_360,
                  (ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                   *)&local_368,
                  (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)
                  &local_378);
      Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
                ((Type *)&psidd_3.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                          m_storage.m_cols,
                 (DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_20,
                 (ulong)(Ne2 + 4 + Ne3),local_34);
      Eigen::MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>::
      array(&local_3b0,
            (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_> *
            )&psidd_3.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols);
      Eigen::
      ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>>
      ::operator*(&local_348,
                  (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>>
                   *)&local_360,
                  (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                   *)&local_3b0);
      local_2e8 = Eigen::
                  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>_>
                  ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>_>
                         *)&local_348);
      peVar12 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                          ((span<const_lf::mesh::Orientation,_18446744073709551615UL> *)
                           &nodevals[5].
                            super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                            .m_cols,2);
      IVar14 = psidd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols
      ;
      if (*peVar12 == positive) {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,3);
        dVar17 = *pdVar8;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,2);
        uVar13 = P0._0_4_;
        dVar17 = ((double)IVar14 * dVar17 - dVar16 * *pdVar8) - local_2e8;
        iVar5 = P0._0_4_ * 2;
        paVar15 = (array<unsigned_int,_4UL> *)
                  ((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>)
                          .m_storage.m_cols + 4);
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,0);
        vVar1 = *pvVar6;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,1);
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                            (ulong)(vVar1 + *pvVar6 + uVar13));
        *pSVar9 = dVar17 * (double)(iVar5 - 1);
      }
      else {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,2);
        dVar17 = *pdVar8;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,3);
        uVar13 = P0._0_4_;
        dVar17 = ((double)IVar14 * dVar17 - dVar16 * *pdVar8) - local_2e8;
        iVar5 = P0._0_4_ * 2;
        paVar15 = (array<unsigned_int,_4UL> *)
                  ((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>)
                          .m_storage.m_cols + 4);
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,0);
        vVar1 = *pvVar6;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,1);
        vVar2 = *pvVar6;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,2);
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                            (ulong)(((vVar1 + vVar2 + *pvVar6) - uVar13) + 2));
        *pSVar9 = dVar17 * (double)(iVar5 - 1);
      }
      Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_2c8);
    }
    uVar13 = P0._0_4_;
    pvVar6 = std::array<unsigned_int,_4UL>::operator[]
                       ((array<unsigned_int,_4UL> *)
                        ((long)&(nodevals->
                                super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                                m_storage.m_cols + 4),3);
    if (uVar13 <= *pvVar6) {
      ppQVar7 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[]
                          ((array<const_lf::quad::QuadRule_*,_4UL> *)(nodevals + 2),3);
      pDVar10 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)quad::QuadRule::Points(*ppQVar7);
      integ4 = (double)&P0;
      CVar21 = Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
               unaryExpr<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_4_>
                         (pDVar10,(anon_class_8_1_54a39809_for_op *)&integ4);
      local_408 = CVar21;
      Eigen::Matrix<double,1,-1,1,1,-1>::
      Matrix<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicQuad<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_4_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                ((Matrix<double,1,_1,1,1,_1> *)local_3f8,
                 (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:1623:17),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_408);
      ppQVar7 = std::array<const_lf::quad::QuadRule_*,_4UL>::operator[]
                          ((array<const_lf::quad::QuadRule_*,_4UL> *)(nodevals + 2),3);
      pDVar11 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                quad::QuadRule::Weights(*ppQVar7);
      local_4a0 = (non_const_type)
                  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose(pDVar11);
      local_498.m_matrix =
           (non_const_type)
           Eigen::MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::
           array((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                 &local_4a0);
      local_4a8 = (NestedExpressionType)
                  Eigen::MatrixBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::array
                            ((MatrixBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_3f8);
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
      ::operator*(&local_490,
                  (ArrayBase<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                   *)&local_498,
                  (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_> *)
                  &local_4a8);
      Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
                ((Type *)local_518,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_20,
                 (ulong)(local_34 + 4 + Ne2 + Ne3),local_38);
      Eigen::MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>::
      array(&local_4e0,
            (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_> *
            )local_518);
      Eigen::
      ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>>const>>
      ::operator*(&local_478,
                  (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>>const>>
                   *)&local_490,
                  (ArrayBase<Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                   *)&local_4e0);
      local_418 = Eigen::
                  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>_>
                  ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>_>
                         *)&local_478);
      peVar12 = std::span<const_lf::mesh::Orientation,_18446744073709551615UL>::operator[]
                          ((span<const_lf::mesh::Orientation,_18446744073709551615UL> *)
                           &nodevals[5].
                            super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage
                            .m_cols,3);
      IVar14 = psidd.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols
      ;
      if (*peVar12 == positive) {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,0);
        dVar17 = *pdVar8;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,3);
        uVar13 = P0._0_4_;
        dVar16 = ((double)IVar14 * dVar17 - dVar16 * *pdVar8) - local_418;
        iVar5 = P0._0_4_ * 2;
        paVar15 = (array<unsigned_int,_4UL> *)
                  ((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>)
                          .m_storage.m_cols + 4);
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,0);
        vVar1 = *pvVar6;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,1);
        vVar2 = *pvVar6;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,2);
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                            (ulong)((uVar13 - 1) + vVar1 + vVar2 + *pvVar6));
        *pSVar9 = dVar16 * (double)(iVar5 - 1);
      }
      else {
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,3);
        dVar17 = *pdVar8;
        pdVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                           (local_20,0);
        uVar13 = P0._0_4_;
        dVar16 = ((double)IVar14 * dVar17 - dVar16 * *pdVar8) - local_418;
        iVar5 = P0._0_4_ * 2;
        paVar15 = (array<unsigned_int,_4UL> *)
                  ((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>)
                          .m_storage.m_cols + 4);
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,0);
        vVar1 = *pvVar6;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,1);
        vVar2 = *pvVar6;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,2);
        vVar3 = *pvVar6;
        pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,3);
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)this,
                            (ulong)(((vVar1 + vVar2 + vVar3 + *pvVar6) - uVar13) + 1));
        *pSVar9 = dVar16 * (double)(iVar5 - 1);
      }
      Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_3f8);
    }
    P0._0_4_ = P0._0_4_ + 1;
  }
  IVar14 = extraout_RDX;
  if (1 < (uint)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage
                .m_cols) {
    dof_temp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._4_4_
         = FeHierarchicSegment<double>::NumEvaluationNodes
                     ((FeHierarchicSegment<double> *)(nodevals + 4));
    local_53c = (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                     m_storage.m_cols - 1;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,unsigned_int>
              ((Matrix<double,_1,_1,0,_1,_1> *)&i_1,
               (uint *)((long)&dof_temp.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_cols + 4),&local_53c);
    for (local_540 = 0;
        local_540 <
        dof_temp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
        _4_4_; local_540 = local_540 + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
                (&local_5d0,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_20,
                 (ulong)(dof_temp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols._4_4_ * local_540 + 4 + Ne2 + Ne3 + local_34 + local_38),
                 dof_temp.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_cols._4_4_);
      Eigen::Matrix<double,1,-1,1,1,-1>::
      Matrix<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>const,1,_1,false>>
                ((Matrix<double,1,_1,1,1,_1> *)&local_598,
                 (EigenBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>
                  *)&local_5d0);
      FeHierarchicSegment<double>::NodalValuesToDofs
                ((FeHierarchicSegment<double> *)local_588,nodevals + 4);
      Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
                (&local_578,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_588,2,
                 (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                      m_storage.m_cols - 1);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                ((RowXpr *)
                 &dof_temp2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&i_1,
                 (ulong)local_540);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)
                 &dof_temp2.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_> *)
                 &local_578);
      Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_588);
      Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix(&local_598);
    }
    i_2 = (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
               m_cols - 1;
    local_628 = (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                     m_storage.m_cols - 1;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<unsigned_int,unsigned_int>
              ((Matrix<double,_1,_1,0,_1,_1> *)local_620,&i_2,&local_628);
    for (local_62c = 0;
        local_62c <
        (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
             m_cols - 1U; local_62c = local_62c + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_6c0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&i_1,
                 (ulong)local_62c);
      Eigen::Matrix<double,1,-1,1,1,-1>::
      Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                ((Matrix<double,1,_1,1,1,_1> *)&local_688,
                 (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &local_6c0);
      FeHierarchicSegment<double>::NodalValuesToDofs
                ((FeHierarchicSegment<double> *)local_678,nodevals + 4);
      Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
                (&local_668,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)local_678,2,
                 (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                      m_storage.m_cols - 1);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
                (&local_6f8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_620,
                 (ulong)local_62c);
      other = (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
              Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
                        ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&local_6f8,
                         (DenseBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>
                          *)&local_668);
      paVar15 = (array<unsigned_int,_4UL> *)
                ((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                        m_storage.m_cols + 4);
      pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,0);
      vVar1 = *pvVar6;
      pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,1);
      vVar2 = *pvVar6;
      pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,2);
      vVar3 = *pvVar6;
      pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,3);
      uVar13 = (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                    m_storage.m_cols - 1;
      Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
                (&local_730,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,
                 (ulong)(vVar1 + vVar2 + vVar3 + *pvVar6 + local_62c * uVar13),uVar13);
      Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>,1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false> *)&local_730,other);
      Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix((Matrix<double,_1,__1,_1,_1,__1> *)local_678);
      Eigen::Matrix<double,_1,_-1,_1,_1,_-1>::~Matrix(&local_688);
    }
    dataPtr = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::data
                        ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_620);
    iVar5 = (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                 m_storage.m_cols + -1;
    Eigen::Stride<0,_0>::Stride(&local_752);
    Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
              (&local_750,dataPtr,1,(ulong)(uint)(iVar5 * iVar5),&local_752);
    paVar15 = (array<unsigned_int,_4UL> *)
              ((long)&(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                      m_storage.m_cols + 4);
    pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,0);
    vVar1 = *pvVar6;
    pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,1);
    vVar2 = *pvVar6;
    pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,2);
    vVar3 = *pvVar6;
    pvVar6 = std::array<unsigned_int,_4UL>::operator[](paVar15,3);
    iVar5 = (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                 m_storage.m_cols + -1;
    Eigen::DenseBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::segment<unsigned_int>
              (&local_790,(DenseBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,
               (ulong)(vVar1 + vVar2 + vVar3 + *pvVar6),iVar5 * iVar5);
    Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,1,_1,1,1,_1>,1,_1,false> *)&local_790,
               (DenseBase<Eigen::Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&local_750);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_620);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)&i_1);
    IVar14 = extraout_RDX_00;
  }
  MVar22.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = IVar14;
  MVar22.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)this;
  return (Matrix<double,_1,__1,_1,_1,__1>)
         MVar22.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> NodalValuesToDofs(
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> &nodevals) const override {
    Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> dofs(NumRefShapeFunctions());
    const base::size_type Ne0 =
        edge_degrees_[0] > 1 ? qr_dual_edge_[0]->NumPoints() : 0;
    const base::size_type Ne1 =
        edge_degrees_[1] > 1 ? qr_dual_edge_[1]->NumPoints() : 0;
    const base::size_type Ne2 =
        edge_degrees_[2] > 1 ? qr_dual_edge_[2]->NumPoints() : 0;
    const base::size_type Ne3 =
        edge_degrees_[3] > 1 ? qr_dual_edge_[3]->NumPoints() : 0;

    // Compute the basis function coefficients of the vertex basis functions
    dofs[0] = nodevals[0];
    dofs[1] = nodevals[1];
    dofs[2] = nodevals[2];
    dofs[3] = nodevals[3];
    // Compute the basis function coefficients on the edges
    // by applying the dual basis of the segment
    for (lf::base::size_type i = 2; i < Degree() + 1; ++i) {
      const SCALAR P0 = ILegendreDx(i, 0);
      const SCALAR P1 = ILegendreDx(i, 1);

      // Compute the basis function coefficients for the first edge
      if (i <= edge_degrees_[0]) {
        Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
            qr_dual_edge_[0]->Points().unaryExpr(
                [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });
        const SCALAR integ1 = (qr_dual_edge_[0]->Weights().transpose().array() *
                               psidd.array() * nodevals.segment(4, Ne0).array())
                                  .sum();
        if (rel_orient_[0] == lf::mesh::Orientation::positive) {
          dofs[2 + i] =
              (P1 * nodevals[1] - P0 * nodevals[0] - integ1) * (2 * i - 1);
        } else {
          dofs[5 - i + (edge_degrees_[0] - 1)] =
              (P1 * nodevals[0] - P0 * nodevals[1] - integ1) * (2 * i - 1);
        }
      }
      if (i <= edge_degrees_[1]) {
        // Compute the basis function coefficients for the second edge
        Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
            qr_dual_edge_[1]->Points().unaryExpr(
                [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });
        const SCALAR integ2 =
            (qr_dual_edge_[1]->Weights().transpose().array() * psidd.array() *
             nodevals.segment(4 + Ne0, Ne1).array())
                .sum();
        if (rel_orient_[1] == lf::mesh::Orientation::positive) {
          dofs[2 + i + (edge_degrees_[0] - 1)] =
              (P1 * nodevals[2] - P0 * nodevals[1] - integ2) * (2 * i - 1);
        } else {
          dofs[5 - i + (edge_degrees_[0] + edge_degrees_[1] - 2)] =
              (P1 * nodevals[1] - P0 * nodevals[2] - integ2) * (2 * i - 1);
        }
      }
      if (i <= edge_degrees_[2]) {
        // Compute the basis function coefficients for the third edge
        Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
            qr_dual_edge_[2]->Points().unaryExpr(
                [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });
        const SCALAR integ3 =
            (qr_dual_edge_[2]->Weights().transpose().array() * psidd.array() *
             nodevals.segment(4 + Ne0 + Ne1, Ne2).array())
                .sum();
        if (rel_orient_[2] == lf::mesh::Orientation::positive) {
          dofs[2 + i + (edge_degrees_[0] + edge_degrees_[1] - 2)] =
              (P1 * nodevals[3] - P0 * nodevals[2] - integ3) * (2 * i - 1);
        } else {
          dofs[5 - i +
               (edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] - 3)] =
              (P1 * nodevals[2] - P0 * nodevals[3] - integ3) * (2 * i - 1);
        }
      }
      if (i <= edge_degrees_[3]) {
        // Compute the basis function coefficients for the fourth edge
        Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
            qr_dual_edge_[3]->Points().unaryExpr(
                [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });
        const SCALAR integ4 =
            (qr_dual_edge_[3]->Weights().transpose().array() * psidd.array() *
             nodevals.segment(4 + Ne0 + Ne1 + Ne2, Ne3).array())
                .sum();
        if (rel_orient_[3] == lf::mesh::Orientation::positive) {
          dofs[2 + i +
               (edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] - 3)] =
              (P1 * nodevals[0] - P0 * nodevals[3] - integ4) * (2 * i - 1);
        } else {
          dofs[5 - i +
               (edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] +
                edge_degrees_[3] - 4)] =
              (P1 * nodevals[3] - P0 * nodevals[0] - integ4) * (2 * i - 1);
        }
      }
    }
    if (interior_degree_ > 1) {
      // Compute the basis function coefficients for the face bubbles
      auto Nq = fe1d_.NumEvaluationNodes();
      Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> dof_temp(
          Nq, interior_degree_ - 1);
      for (unsigned i = 0; i < Nq; ++i) {
        dof_temp.row(i) = fe1d_
                              .NodalValuesToDofs(nodevals.segment(
                                  4 + Ne0 + Ne1 + Ne2 + Ne3 + Nq * i, Nq))
                              .segment(2, interior_degree_ - 1);
      }
      Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> dof_temp2(
          interior_degree_ - 1, interior_degree_ - 1);
      for (unsigned i = 0; i < interior_degree_ - 1; ++i) {
        dofs.segment(edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] +
                         edge_degrees_[3] + i * (interior_degree_ - 1),
                     interior_degree_ - 1) = dof_temp2.row(i) =
            fe1d_.NodalValuesToDofs(dof_temp.col(i))
                .segment(2, interior_degree_ - 1);
      }
      dofs.segment(edge_degrees_[0] + edge_degrees_[1] + edge_degrees_[2] +
                       edge_degrees_[3],
                   (interior_degree_ - 1) * (interior_degree_ - 1)) =
          Eigen::Map<Eigen::Matrix<SCALAR, 1, Eigen::Dynamic>>(
              dof_temp2.data(), 1,
              (interior_degree_ - 1) * (interior_degree_ - 1));
    }
    return dofs;
  }